

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void processMSG(UA_Server *server,UA_SecureChannel *channel,UA_UInt32 requestId,UA_ByteString *msg)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  uint uVar6;
  UA_Logger p_Var7;
  UA_Connection *pUVar8;
  bool bVar9;
  UA_DataTypeMember *pUVar10;
  UA_UInt32 requestId_00;
  char *pcVar11;
  UA_Server *pUVar12;
  UA_Boolean UVar13;
  UA_StatusCode UVar14;
  UA_Session *session;
  UA_DataType *pUVar15;
  UA_DataType *pUVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  undefined4 uVar20;
  __suseconds_t *unaff_RBX;
  undefined7 uVar21;
  UA_CreateSessionRequest *request;
  undefined4 uVar22;
  undefined7 uVar23;
  code *pcVar24;
  UA_SessionManager *pUVar25;
  undefined8 uVar26;
  ulong uVar27;
  undefined4 uVar28;
  uint uVar29;
  undefined4 uVar30;
  undefined8 in_R11;
  UA_CreateSessionRequest *response;
  UA_CreateSessionRequest *response_00;
  SessionEntry *pSVar31;
  UA_SecureChannel *pUVar32;
  UA_String *pUStack_240;
  size_t sStack_238;
  UA_Byte *pUStack_230;
  size_t sStack_228;
  UA_Byte *pUStack_220;
  size_t sStack_218;
  UA_Byte *pUStack_210;
  size_t sStack_208;
  UA_Byte *pUStack_200;
  size_t sStack_1f8;
  UA_Byte *pUStack_1f0;
  UA_Double UStack_1e8;
  UA_UInt32 aUStack_1e0 [2];
  undefined1 local_1d8 [16];
  size_t local_1c8;
  UA_Byte *pUStack_1c0;
  UA_UInt32 local_1b8 [2];
  UA_Byte *pUStack_1b0;
  size_t local_1a8;
  UA_Byte *pUStack_1a0;
  undefined8 local_198;
  size_t sStack_190;
  UA_Byte *local_188;
  size_t sStack_180;
  UA_Byte *pUStack_178;
  undefined1 uStack_170;
  undefined7 local_16f;
  undefined1 uStack_168;
  undefined8 uStack_167;
  size_t local_158;
  UA_Byte *pUStack_150;
  UA_NodeId local_148;
  UA_NodeId UStack_130;
  undefined8 local_118;
  UA_Double UStack_110;
  UA_DateTime local_108;
  UA_SecureChannel *pUStack_100;
  UA_UInt16 local_f8;
  ContinuationPointList local_f0;
  UA_UInt32 local_e8;
  UA_ListOfUASubscriptions local_e0;
  UA_PublishResponseEntry *pUStack_d8;
  UA_PublishResponseEntry **local_d0;
  undefined1 local_c8 [8];
  timeval tv;
  UA_NodeId requestTypeId;
  undefined1 local_98 [8];
  size_t ppos;
  anon_union_16_4_621dfe33_for_identifier local_88;
  ulong local_78;
  UA_DataTypeMember *local_70;
  undefined8 local_68;
  UA_CreateSessionRequest *local_60;
  char *local_58;
  UA_DataType *local_50;
  UA_DataType *local_48;
  UA_Server *local_40;
  UA_SecureChannel *local_38;
  
  request = (UA_CreateSessionRequest *)local_1d8;
  pUVar16 = (UA_DataType *)local_98;
  local_98 = (undefined1  [8])0x0;
  aUStack_1e0[0] = 0x12b29a;
  aUStack_1e0[1] = 0;
  UVar14 = UA_decodeBinary(msg,(size_t *)pUVar16,&tv.tv_usec,UA_TYPES + 0x10);
  if (UVar14 != 0) {
    return;
  }
  if (tv.tv_usec._4_4_ != 0) {
    pUVar16 = UA_TYPES + 0x10;
    unaff_RBX = &tv.tv_usec;
    aUStack_1e0[0] = 0x12b2c1;
    aUStack_1e0[1] = 0;
    deleteMembers_noInit(unaff_RBX,UA_TYPES + 0x10);
    tv.tv_usec = 0;
    requestTypeId.namespaceIndex = 0;
    requestTypeId._2_2_ = 0;
  }
  local_58 = (char *)local_98;
  uVar23 = (undefined7)((ulong)pUVar16 >> 8);
  uVar22 = (undefined4)CONCAT71(uVar23,1);
  pUVar16 = (UA_DataType *)0x0;
  uVar26 = 0;
  uVar21 = (undefined7)((ulong)unaff_RBX >> 8);
  if ((int)requestTypeId._0_4_ < 0x236) {
    if (0x1ed < (int)requestTypeId._0_4_) {
      if ((int)requestTypeId._0_4_ < 0x20f) {
        if (requestTypeId._0_4_ == 0x1ee) {
          pcVar24 = Service_AddReferences;
          pUVar15 = UA_TYPES + 0x86;
          pUVar16 = UA_TYPES + 0x8a;
        }
        else if (requestTypeId._0_4_ == 500) {
          pcVar24 = Service_DeleteNodes;
          pUVar15 = UA_TYPES + 0x4d;
          pUVar16 = UA_TYPES + 0x80;
        }
        else {
          if (requestTypeId._0_4_ != 0x1fa) goto LAB_0012bae2;
          pcVar24 = Service_DeleteReferences;
          pUVar15 = UA_TYPES + 0x83;
          pUVar16 = UA_TYPES + 0x7d;
        }
      }
      else if ((int)requestTypeId._0_4_ < 0x22a) {
        if (requestTypeId._0_4_ == 0x20f) {
          pcVar24 = Service_Browse;
          pUVar15 = UA_TYPES + 0x96;
          pUVar16 = UA_TYPES + 0xa0;
        }
        else {
          if (requestTypeId._0_4_ != 0x215) goto LAB_0012bae2;
          pcVar24 = Service_BrowseNext;
          pUVar15 = UA_TYPES + 0x5c;
          pUVar16 = UA_TYPES + 0x9e;
        }
      }
      else if (requestTypeId._0_4_ == 0x22a) {
        pcVar24 = Service_TranslateBrowsePathsToNodeIds;
        pUVar15 = UA_TYPES + 0x9f;
        pUVar16 = UA_TYPES + 0x8b;
      }
      else {
        if (requestTypeId._0_4_ != 0x230) goto LAB_0012bae2;
        pcVar24 = Service_RegisterNodes;
        pUVar15 = UA_TYPES + 0x4c;
        pUVar16 = UA_TYPES + 0x62;
      }
      goto LAB_0012b7b8;
    }
    if ((int)requestTypeId._0_4_ < 0x1d3) {
      if (requestTypeId._0_4_ == 0x1a6) {
        pcVar24 = Service_FindServers;
        pUVar15 = UA_TYPES + 0x75;
        pUVar16 = UA_TYPES + 0x91;
LAB_0012b668:
        uVar22 = 0;
        goto LAB_0012b7b8;
      }
      if (requestTypeId._0_4_ == 0x1ac) {
        pcVar24 = Service_GetEndpoints;
        pUVar15 = UA_TYPES + 0x6e;
        pUVar16 = UA_TYPES + 0x9c;
        goto LAB_0012b668;
      }
      bVar9 = true;
      uVar30 = 0;
      uVar28 = 0;
      pUVar15 = (UA_DataType *)0x0;
      uVar20 = (undefined4)CONCAT71(uVar21,1);
      pcVar24 = (code *)0x0;
      if (requestTypeId._0_4_ != 0x1cd) goto LAB_0012b7c5;
      pcVar24 = Service_CreateSession;
      pUVar15 = UA_TYPES + 0x99;
      uVar26 = 1;
      pUVar16 = UA_TYPES + 0xa1;
      uVar22 = 0;
      goto LAB_0012b7bd;
    }
    if (requestTypeId._0_4_ != 0x1d3) {
      if (requestTypeId._0_4_ == 0x1d9) {
        pcVar24 = Service_CloseSession;
        pUVar15 = UA_TYPES + 99;
        pUVar16 = UA_TYPES + 0x8e;
      }
      else {
        if (requestTypeId._0_4_ != 0x1e8) goto LAB_0012bae2;
        pcVar24 = Service_AddNodes;
        pUVar15 = UA_TYPES + 0x95;
        pUVar16 = UA_TYPES + 0x70;
      }
      goto LAB_0012b7b8;
    }
    pcVar24 = Service_ActivateSession;
    pUVar15 = UA_TYPES + 0x53;
    pUVar16 = UA_TYPES + 0x58;
    uVar22 = (undefined4)CONCAT71(uVar23,1);
    uVar26 = 0;
    uVar30 = (undefined4)CONCAT71((int7)((ulong)in_R11 >> 8),1);
LAB_0012b7c0:
    bVar9 = false;
    uVar28 = 0;
    uVar20 = 0;
  }
  else {
    if ((int)requestTypeId._0_4_ < 0x30d) {
      if ((int)requestTypeId._0_4_ < 0x2c8) {
        if (requestTypeId._0_4_ == 0x236) {
          pcVar24 = Service_UnregisterNodes;
          pUVar15 = UA_TYPES + 0x2a;
          pUVar16 = UA_TYPES + 0x69;
        }
        else if (requestTypeId._0_4_ == 0x277) {
          pcVar24 = Service_Read;
          pUVar15 = UA_TYPES + 0x87;
          pUVar16 = UA_TYPES + 0x85;
        }
        else {
          if (requestTypeId._0_4_ != 0x2a1) goto LAB_0012bae2;
          pcVar24 = Service_Write;
          pUVar15 = UA_TYPES + 0x6a;
          pUVar16 = UA_TYPES + 0x5b;
        }
      }
      else if ((int)requestTypeId._0_4_ < 0x2fb) {
        if (requestTypeId._0_4_ == 0x2c8) {
          pcVar24 = Service_Call;
          pUVar15 = UA_TYPES + 0x30;
          pUVar16 = UA_TYPES + 0x7f;
        }
        else {
          if (requestTypeId._0_4_ != 0x2ef) {
LAB_0012bae2:
            bVar9 = true;
            uVar28 = 0;
            pUVar15 = (UA_DataType *)0x0;
            goto LAB_0012baec;
          }
          pcVar24 = Service_CreateMonitoredItems;
          pUVar15 = UA_TYPES + 0x92;
          pUVar16 = UA_TYPES + 0x7e;
        }
      }
      else if (requestTypeId._0_4_ == 0x2fb) {
        pcVar24 = Service_ModifyMonitoredItems;
        pUVar15 = UA_TYPES + 0x73;
        pUVar16 = UA_TYPES + 0x84;
      }
      else {
        if (requestTypeId._0_4_ != 0x301) goto LAB_0012bae2;
        pcVar24 = Service_SetMonitoringMode;
        pUVar15 = UA_TYPES + 0x68;
        pUVar16 = UA_TYPES + 0x74;
      }
LAB_0012b7b8:
      uVar26 = 0;
LAB_0012b7bd:
      uVar30 = 0;
      goto LAB_0012b7c0;
    }
    if ((int)requestTypeId._0_4_ < 799) {
      if (requestTypeId._0_4_ == 0x30d) {
        pcVar24 = Service_DeleteMonitoredItems;
        pUVar15 = UA_TYPES + 0x66;
        pUVar16 = UA_TYPES + 0x4a;
      }
      else if (requestTypeId._0_4_ == 0x313) {
        pcVar24 = Service_CreateSubscription;
        pUVar15 = UA_TYPES + 0x5d;
        pUVar16 = UA_TYPES + 0x7a;
      }
      else {
        if (requestTypeId._0_4_ != 0x319) goto LAB_0012bae2;
        pcVar24 = Service_ModifySubscription;
        pUVar15 = UA_TYPES + 100;
        pUVar16 = UA_TYPES + 0x60;
      }
      goto LAB_0012b7b8;
    }
    if (0x33f < (int)requestTypeId._0_4_) {
      if (requestTypeId._0_4_ == 0x340) {
        pcVar24 = Service_Republish;
        pUVar15 = UA_TYPES + 0x6d;
        pUVar16 = UA_TYPES + 0x81;
      }
      else {
        if (requestTypeId._0_4_ != 0x34f) goto LAB_0012bae2;
        pcVar24 = Service_DeleteSubscriptions;
        pUVar15 = UA_TYPES + 0x48;
        pUVar16 = UA_TYPES + 0x7b;
      }
      goto LAB_0012b7b8;
    }
    if (requestTypeId._0_4_ == 799) {
      pcVar24 = Service_SetPublishingMode;
      pUVar15 = UA_TYPES + 0x2e;
      pUVar16 = UA_TYPES + 0x77;
      goto LAB_0012b7b8;
    }
    bVar9 = true;
    uVar30 = 0;
    uVar28 = 0;
    pUVar15 = (UA_DataType *)0x0;
    unaff_RBX = (__suseconds_t *)CONCAT71(uVar21,1);
    uVar20 = SUB84(unaff_RBX,0);
    pcVar24 = (code *)0x0;
    if (requestTypeId._0_4_ == 0x33a) {
      pUVar15 = UA_TYPES + 0x6f;
      pUVar16 = UA_TYPES + 0x4e;
      bVar9 = false;
      uVar28 = 1;
LAB_0012baec:
      uVar30 = 0;
      uVar26 = 0;
      uVar22 = (undefined4)CONCAT71(uVar23,1);
      uVar20 = (undefined4)CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
      pcVar24 = (code *)0x0;
    }
  }
LAB_0012b7c5:
  if (bVar9) {
    p_Var7 = (server->config).logger;
    pUVar8 = channel->connection;
    if (requestTypeId._0_4_ == 0x313) {
      if (pUVar8 == (UA_Connection *)0x0) {
        uVar18 = 0;
      }
      else {
        uVar18 = (ulong)(uint)pUVar8->sockfd;
      }
      aUStack_1e0[0] = 0x12b8d2;
      aUStack_1e0[1] = 0;
      UA_LOG_INFO(p_Var7,UA_LOGCATEGORY_SECURECHANNEL,
                  "Connection %i | SecureChannel %i | Client requested a subscription, but those are not enabled in the build"
                  ,uVar18,(ulong)(channel->securityToken).channelId);
    }
    else {
      if (pUVar8 == (UA_Connection *)0x0) {
        uVar18 = 0;
      }
      else {
        uVar18 = (ulong)(uint)pUVar8->sockfd;
      }
      aUStack_1e0[0] = 0x12b8ed;
      aUStack_1e0[1] = 0;
      UA_LOG_INFO(p_Var7,UA_LOGCATEGORY_SECURECHANNEL,
                  "Connection %i | SecureChannel %i | Unknown request with type identifier %i",
                  uVar18,(ulong)(channel->securityToken).channelId);
    }
    UVar14 = 0x800b0000;
    pUVar16 = UA_TYPES + 0x90;
LAB_0012b907:
    pcVar11 = local_58;
    *(undefined8 *)&request[-1].maxResponseMessageSize = 0x12b90c;
    sendError(channel,msg,(size_t)pcVar11,pUVar16,requestId,UVar14);
    return;
  }
  local_88.numeric = uVar20;
  ppos = CONCAT44(ppos._4_4_,uVar30);
  local_78 = CONCAT44(local_78._4_4_,uVar28);
  local_88._8_4_ = uVar22;
  lVar17 = -(ulong)(pUVar15->memSize + 0xf & 0xfffffff0);
  request = (UA_CreateSessionRequest *)(local_1d8 + lVar17);
  local_70 = (UA_DataTypeMember *)pcVar24;
  local_68 = uVar26;
  local_48 = pUVar16;
  local_38 = channel;
  *(undefined8 *)((long)aUStack_1e0 + lVar17) = 0x12b83e;
  UVar14 = UA_decodeBinary(msg,(size_t *)local_98,request,pUVar15);
  pUVar16 = local_48;
  channel = local_38;
  if (UVar14 != 0) goto LAB_0012b907;
  uVar5 = local_48->memSize;
  response = (UA_CreateSessionRequest *)((long)request - (ulong)(uVar5 + 0xf & 0xfffffff0));
  local_50 = pUVar15;
  local_40 = server;
  *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12b891;
  memset(response,0,(ulong)uVar5);
  pUVar32 = local_38;
  pUVar12 = local_40;
  uVar26 = local_88.string.length;
  if ((char)local_68 == '\0') {
    local_60 = response;
    local_68 = CONCAT44(local_68._4_4_,requestId);
    pSVar31 = (SessionEntry *)&local_38->sessions;
    do {
      pSVar31 = (pSVar31->pointers).le_next;
      if (pSVar31 == (SessionEntry *)0x0) {
        session = (UA_Session *)0x0;
        break;
      }
      session = pSVar31->session;
      *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12b94c;
      UVar13 = UA_NodeId_equal(&session->authenticationToken,(UA_NodeId *)request);
    } while (!UVar13);
    if (session == (UA_Session *)0x0) {
      pUVar25 = &local_40->sessionManager;
      *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12b96a;
      session = UA_SessionManager_getSession(pUVar25,(UA_NodeId *)request);
    }
    pUVar32 = local_38;
    pUVar12 = local_40;
    pUVar15 = local_48;
    pUVar16 = local_50;
    pcVar11 = local_58;
    response_00 = local_60;
    requestId = (UA_UInt32)local_68;
    if ((char)ppos == '\0') {
      if (session == (UA_Session *)0x0) {
        if (local_88.guid.data4[0] != '\0') {
          p_Var7 = (local_40->config).logger;
          if (local_38->connection == (UA_Connection *)0x0) {
            uVar18 = 0;
          }
          else {
            uVar18 = (ulong)(uint)local_38->connection->sockfd;
          }
          uVar29 = (local_38->securityToken).channelId;
          uVar5 = local_50->binaryEncodingId;
          *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12bdaa;
          UA_LOG_INFO(p_Var7,UA_LOGCATEGORY_SECURECHANNEL,
                      "Connection %i | SecureChannel %i | Service request %i without a valid session"
                      ,uVar18,(ulong)uVar29,(ulong)uVar5);
          pUVar15 = local_48;
          pcVar11 = local_58;
          *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12bdc6;
          sendError(pUVar32,msg,(size_t)pcVar11,pUVar15,requestId,0x80250000);
          *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12bdd1;
          deleteMembers_noInit(request,pUVar16);
          uVar5 = pUVar16->memSize;
          goto LAB_0012bd56;
        }
        uStack_168 = 0;
        uStack_167 = 0;
        pUStack_178 = (UA_Byte *)0x0;
        uStack_170 = 0;
        local_16f = 0;
        local_188 = (UA_Byte *)0x0;
        sStack_180 = 0;
        local_198._0_4_ = UA_APPLICATIONTYPE_SERVER;
        local_198._4_4_ = 0;
        sStack_190 = 0;
        local_1a8 = 0;
        pUStack_1a0 = (UA_Byte *)0x0;
        local_1b8[0] = 0;
        local_1b8[1] = 0;
        pUStack_1b0 = (UA_Byte *)0x0;
        local_1c8 = 0;
        pUStack_1c0 = (UA_Byte *)0x0;
        local_1d8._0_8_ = 0;
        local_1d8._8_8_ = (UA_Byte *)0x0;
        local_158 = 0;
        pUStack_150 = (UA_Byte *)0x0;
        local_148.namespaceIndex = 0;
        local_148._2_2_ = 0;
        local_148.identifierType = UA_NODEIDTYPE_NUMERIC;
        local_148.identifier.string.length = 0;
        local_148.identifier.string.data = (UA_Byte *)0x0;
        local_118._0_4_ = 0;
        local_118._4_4_ = 0;
        UStack_110 = 0.0;
        local_108 = 0;
        local_f8 = 5;
        local_f0.lh_first = (ContinuationPointEntry *)0x0;
        local_e8 = 0;
        local_e0.lh_first = (UA_Subscription *)0x0;
        pUStack_d8 = (UA_PublishResponseEntry *)0x0;
        local_d0 = &pUStack_d8;
        UStack_130.namespaceIndex = 0;
        UStack_130._2_2_ = 0;
        UStack_130.identifierType = UA_NODEIDTYPE_GUID;
        UStack_130.identifier.string.length = 0;
        UStack_130.identifier.string.data = (UA_Byte *)0x0;
        pUStack_100 = local_38;
        session = (UA_Session *)local_1d8;
      }
      if ((local_88.guid.data4[0] == '\0') || (session->activated != false)) {
        if (session->channel != local_38) {
          UVar14 = 0x80220000;
          goto LAB_0012bbd7;
        }
        *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12bbe9;
        UA_Session_updateLifetime(session);
        pUVar12 = local_40;
        response_00 = local_60;
        pUVar10 = local_70;
        if ((char)local_78 == '\0') {
          if ((char)uVar26 != '\0') {
            *(code **)&response[-1].maxResponseMessageSize = sendError;
            __assert_fail("service",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                          ,0x4403,
                          "void processMSG(UA_Server *, UA_SecureChannel *, UA_UInt32, const UA_ByteString *)"
                         );
          }
          *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12bd7a;
          (*(code *)pUVar10)(pUVar12,session,request,response_00);
          pUVar32 = local_38;
          goto LAB_0012b9a4;
        }
        *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12bc05;
        Service_Publish(pUVar12,session,(UA_PublishRequest *)request,requestId);
      }
      else {
        pUVar32 = session->channel;
        uVar27 = 0;
        uVar18 = 0;
        if ((pUVar32 != (UA_SecureChannel *)0x0) && (pUVar32->connection != (UA_Connection *)0x0)) {
          uVar18 = (ulong)(uint)pUVar32->connection->sockfd;
        }
        p_Var7 = (local_40->config).logger;
        if (pUVar32 != (UA_SecureChannel *)0x0) {
          uVar27 = (ulong)(pUVar32->securityToken).channelId;
        }
        uVar29 = (session->sessionId).identifier.numeric;
        ppos = (ulong)(session->sessionId).identifier.guid.data2;
        local_88.string.length = (ulong)(session->sessionId).identifier.guid.data3;
        local_88._9_1_ = '\0';
        local_88._10_1_ = '\0';
        local_88._11_1_ = '\0';
        local_88._12_1_ = '\0';
        local_88._13_1_ = '\0';
        local_88._14_1_ = '\0';
        local_88._15_1_ = '\0';
        local_88._8_1_ = (session->sessionId).identifier.guid.data4[0];
        local_78 = (ulong)(session->sessionId).identifier.guid.data4[1];
        local_70 = (UA_DataTypeMember *)(ulong)(session->sessionId).identifier.guid.data4[2];
        local_60 = (UA_CreateSessionRequest *)(ulong)(session->sessionId).identifier.guid.data4[3];
        bVar1 = (session->sessionId).identifier.guid.data4[4];
        bVar2 = (session->sessionId).identifier.guid.data4[5];
        bVar3 = (session->sessionId).identifier.guid.data4[6];
        bVar4 = (session->sessionId).identifier.guid.data4[7];
        response[-1].requestedSessionTimeout = (UA_Double)(ulong)local_50->binaryEncodingId;
        response[-1].clientCertificate.data = (UA_Byte *)(ulong)bVar4;
        response[-1].clientCertificate.length = (ulong)bVar3;
        response[-1].clientNonce.data = (UA_Byte *)(ulong)bVar2;
        response[-1].clientNonce.length = (ulong)bVar1;
        response[-1].sessionName.data = (UA_Byte *)local_60;
        response[-1].sessionName.length = (size_t)local_70;
        response[-1].endpointUrl.data = (UA_Byte *)local_78;
        response[-1].endpointUrl.length = (size_t)local_88.string.data;
        response[-1].serverUri.data = (UA_Byte *)local_88.string.length;
        response[-1].serverUri.length = ppos;
        response[-1].clientDescription.discoveryUrls = (UA_String *)0x12bd07;
        UA_LOG_INFO(p_Var7,UA_LOGCATEGORY_SESSION,
                    "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Calling service %i on a non-activated session"
                    ,uVar18,uVar27,(ulong)uVar29);
        pUVar32 = local_38;
        pUVar16 = local_48;
        pcVar11 = local_58;
        requestId_00 = (UA_UInt32)local_68;
        *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12bd29;
        sendError(pUVar32,msg,(size_t)pcVar11,pUVar16,requestId_00,0x80270000);
        pUVar25 = &local_40->sessionManager;
        *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12bd40;
        UA_SessionManager_removeSession(pUVar25,&session->authenticationToken);
      }
    }
    else {
      if (session != (UA_Session *)0x0) {
        *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12b9a4;
        Service_ActivateSession
                  (pUVar12,pUVar32,session,(UA_ActivateSessionRequest *)request,
                   (UA_ActivateSessionResponse *)response_00);
        goto LAB_0012b9a4;
      }
      UVar14 = 0x80250000;
LAB_0012bbd7:
      *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12bbdc;
      sendError(pUVar32,msg,(size_t)pcVar11,pUVar15,requestId,UVar14);
    }
    pUVar16 = local_50;
    *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12bd4f;
    deleteMembers_noInit(request,pUVar16);
    uVar5 = pUVar16->memSize;
  }
  else {
    *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12b8b1;
    Service_CreateSession(pUVar12,pUVar32,request,(UA_CreateSessionResponse *)response);
    response_00 = response;
LAB_0012b9a4:
    ((UA_ResponseHeader *)&response_00->requestHeader)->requestHandle =
         *(UA_UInt32 *)((long)local_1b8 + lVar17);
    *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12b9c1;
    gettimeofday((timeval *)local_c8,(__timezone_ptr_t)0x0);
    ((UA_ResponseHeader *)&response_00->requestHeader)->timestamp =
         (long)local_c8 * 10000000 + tv.tv_sec * 10 + 0x19db1ded53e8000;
    pUVar16 = local_48;
    *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12b9f8;
    UVar14 = UA_SecureChannel_sendBinaryMessage(pUVar32,requestId,response_00,pUVar16);
    if (UVar14 != 0) {
      uVar29 = 0;
      if (pUVar32->connection != (UA_Connection *)0x0) {
        uVar29 = pUVar32->connection->sockfd;
      }
      p_Var7 = (local_40->config).logger;
      uVar6 = (local_38->securityToken).channelId;
      lVar19 = 0;
      lVar17 = 0x142ba0;
      do {
        if (*(UA_StatusCode *)((long)&statusCodeDescriptions[0].code + lVar19) == UVar14) {
          lVar17 = (long)&statusCodeDescriptions[0].code + lVar19;
          break;
        }
        lVar19 = lVar19 + 0x18;
      } while (lVar19 != 0x1578);
      uVar26 = *(undefined8 *)(lVar17 + 8);
      *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12baa8;
      UA_LOG_INFO(p_Var7,UA_LOGCATEGORY_SECURECHANNEL,
                  "Connection %i | SecureChannel %i | Could not send the message over the SecureChannel with StatusCode %s"
                  ,(ulong)uVar29,(ulong)uVar6,uVar26);
    }
    pUVar16 = local_50;
    *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12bab7;
    deleteMembers_noInit(request,pUVar16);
    uVar5 = pUVar16->memSize;
    *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12bac6;
    memset(request,0,(ulong)uVar5);
    pUVar16 = local_48;
    *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12bad5;
    deleteMembers_noInit(response_00,pUVar16);
    uVar5 = pUVar16->memSize;
    request = response_00;
  }
LAB_0012bd56:
  *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12bd5d;
  memset(request,0,(ulong)uVar5);
  return;
}

Assistant:

static void
processMSG(UA_Server *server, UA_SecureChannel *channel,
           UA_UInt32 requestId, const UA_ByteString *msg) {
    /* At 0, the nodeid starts... */
    size_t ppos = 0;
    size_t *offset = &ppos;

    /* Decode the nodeid */
    UA_NodeId requestTypeId;
    UA_StatusCode retval = UA_NodeId_decodeBinary(msg, offset, &requestTypeId);
    if(retval != UA_STATUSCODE_GOOD)
        return;
    if(requestTypeId.identifierType != UA_NODEIDTYPE_NUMERIC)
        UA_NodeId_deleteMembers(&requestTypeId); /* leads to badserviceunsupported */

    /* Store the start-position of the request */
    size_t requestPos = *offset;

    /* Get the service pointers */
    UA_Service service = NULL;
    const UA_DataType *requestType = NULL;
    const UA_DataType *responseType = NULL;
    UA_Boolean sessionRequired = true;
    getServicePointers(requestTypeId.identifier.numeric, &requestType,
                       &responseType, &service, &sessionRequired);
    if(!requestType) {
        if(requestTypeId.identifier.numeric == 787) {
            UA_LOG_INFO_CHANNEL(server->config.logger, channel,
                                "Client requested a subscription, " \
                                "but those are not enabled in the build");
        } else {
            UA_LOG_INFO_CHANNEL(server->config.logger, channel,
                                "Unknown request with type identifier %i",
                                requestTypeId.identifier.numeric);
        }
        sendError(channel, msg, requestPos, &UA_TYPES[UA_TYPES_SERVICEFAULT],
                  requestId, UA_STATUSCODE_BADSERVICEUNSUPPORTED);
        return;
    }
    UA_assert(responseType);

#ifdef UA_ENABLE_NONSTANDARD_STATELESS
    /* Stateless extension: Sessions are optional */
    sessionRequired = false;
#endif

    /* Decode the request */
    void *request = UA_alloca(requestType->memSize);
    UA_RequestHeader *requestHeader = (UA_RequestHeader*)request;
    retval = UA_decodeBinary(msg, offset, request, requestType);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_LOG_DEBUG_CHANNEL(server->config.logger, channel,
                             "Could not decode the request");
        sendError(channel, msg, requestPos, responseType, requestId, retval);
        return;
    }

    /* Prepare the respone */
    void *response = UA_alloca(responseType->memSize);
    UA_init(response, responseType);
    UA_Session *session = NULL; /* must be initialized before goto send_response */

    /* CreateSession doesn't need a session */
    if(requestType == &UA_TYPES[UA_TYPES_CREATESESSIONREQUEST]) {
        Service_CreateSession(server, channel, request, response);
        goto send_response;
    }

    /* Find the matching session */
    session = UA_SecureChannel_getSession(channel, &requestHeader->authenticationToken);
    if(!session)
        session = UA_SessionManager_getSession(&server->sessionManager,
                                               &requestHeader->authenticationToken);

    if(requestType == &UA_TYPES[UA_TYPES_ACTIVATESESSIONREQUEST]) {
        if(!session) {
            UA_LOG_DEBUG_CHANNEL(server->config.logger, channel,
                                 "Trying to activate a session that is " \
                                 "not known in the server");
            sendError(channel, msg, requestPos, responseType,
                      requestId, UA_STATUSCODE_BADSESSIONIDINVALID);
            UA_deleteMembers(request, requestType);
            return;
        }
        Service_ActivateSession(server, channel, session, request, response);
        goto send_response;
    }

    /* Set an anonymous, inactive session for services that need no session */
    UA_Session anonymousSession;
    if(!session) {
        if(sessionRequired) {
            UA_LOG_INFO_CHANNEL(server->config.logger, channel,
                                "Service request %i without a valid session",
                                requestType->binaryEncodingId);
            sendError(channel, msg, requestPos, responseType,
                      requestId, UA_STATUSCODE_BADSESSIONIDINVALID);
            UA_deleteMembers(request, requestType);
            return;
        }
        UA_Session_init(&anonymousSession);
        anonymousSession.sessionId = UA_NODEID_GUID(0, UA_GUID_NULL);
        anonymousSession.channel = channel;
        session = &anonymousSession;
    }

    /* Trying to use a non-activated session? */
    if(sessionRequired && !session->activated) {
        UA_LOG_INFO_SESSION(server->config.logger, session,
                            "Calling service %i on a non-activated session",
                            requestType->binaryEncodingId);
        sendError(channel, msg, requestPos, responseType,
                  requestId, UA_STATUSCODE_BADSESSIONNOTACTIVATED);
        UA_SessionManager_removeSession(&server->sessionManager,
                                        &session->authenticationToken);
        UA_deleteMembers(request, requestType);
        return;
    }

    /* The session is bound to another channel */
    if(session->channel != channel) {
        UA_LOG_DEBUG_CHANNEL(server->config.logger, channel,
                             "Client tries to use an obsolete securechannel");
        sendError(channel, msg, requestPos, responseType,
                  requestId, UA_STATUSCODE_BADSECURECHANNELIDINVALID);
        UA_deleteMembers(request, requestType);
        return;
    }

    /* Update the session lifetime */
    UA_Session_updateLifetime(session);

#ifdef UA_ENABLE_SUBSCRIPTIONS
    /* The publish request is not answered immediately */
    if(requestType == &UA_TYPES[UA_TYPES_PUBLISHREQUEST]) {
        Service_Publish(server, session, request, requestId);
        UA_deleteMembers(request, requestType);
        return;
    }
#endif

    /* Call the service */
    UA_assert(service); /* For all services besides publish, the service pointer is non-NULL*/
    service(server, session, request, response);

 send_response:
    /* Send the response */
    ((UA_ResponseHeader*)response)->requestHandle = requestHeader->requestHandle;
    ((UA_ResponseHeader*)response)->timestamp = UA_DateTime_now();
    retval = UA_SecureChannel_sendBinaryMessage(channel, requestId, response, responseType);

    if(retval != UA_STATUSCODE_GOOD)
        UA_LOG_INFO_CHANNEL(server->config.logger, channel,
                            "Could not send the message over the SecureChannel "
                            "with StatusCode %s", UA_StatusCode_name(retval));

    /* Clean up */
    UA_deleteMembers(request, requestType);
    UA_deleteMembers(response, responseType);
}